

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_db_release_memory(sqlite3 *db)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  iVar2 = db->nDb;
  if (0 < iVar2) {
    lVar3 = 8;
    lVar4 = 0;
    do {
      lVar1 = *(long *)((long)&db->aDb->zDbSName + lVar3);
      if (lVar1 != 0) {
        (*sqlite3Config.pcache2.xShrink)
                  (*(sqlite3_pcache **)(*(long *)(**(long **)(lVar1 + 8) + 0x118) + 0x40));
        iVar2 = db->nDb;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (lVar4 < iVar2);
  }
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_db_release_memory(sqlite3 *db){
  int i;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  for(i=0; i<db->nDb; i++){
    Btree *pBt = db->aDb[i].pBt;
    if( pBt ){
      Pager *pPager = sqlite3BtreePager(pBt);
      sqlite3PagerShrink(pPager);
    }
  }
  sqlite3BtreeLeaveAll(db);
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}